

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O0

bool Js::CacheOperators::CanCachePropertyWrite
               (RecyclableObject *object,ScriptContext *requestContext)

{
  bool bVar1;
  TypeId typeId;
  ScriptContext *pSVar2;
  byte local_19;
  ScriptContext *requestContext_local;
  RecyclableObject *object_local;
  
  pSVar2 = RecyclableObject::GetScriptContext(object);
  local_19 = 0;
  if (pSVar2 == requestContext) {
    typeId = RecyclableObject::GetTypeId(object);
    bVar1 = DynamicType::Is(typeId);
    local_19 = 0;
    if (bVar1) {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineCachePhase);
      local_19 = bVar1 ^ 0xff;
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool CacheOperators::CanCachePropertyWrite(RecyclableObject * object, ScriptContext * requestContext)
    {
        return object->GetScriptContext() == requestContext && DynamicType::Is(object->GetTypeId()) && !PHASE_OFF1(InlineCachePhase);
    }